

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O2

void __thiscall
ft::set<int,_ft::greater<int>,_ft::allocator<int>_>::erase
          (set<int,_ft::greater<int>,_ft::allocator<int>_> *this,iterator *position)

{
  size_type *psVar1;
  treeNode<int> *ptVar2;
  treeNode<int> *ptVar3;
  iterator local_28;
  
  local_28._vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dcf0;
  local_28.m_tree = position->m_tree;
  local_28.m_node = position->m_node;
  treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>::BSTerase
            ((treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *)this,&local_28);
  psVar1 = &(this->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
            super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_size;
  *psVar1 = *psVar1 - 1;
  if (*psVar1 == 0) {
    ptVar2 = (this->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
             super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree.m_first;
    (this->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
    super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree.m_root =
         (this->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
         super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree.NIL;
    ptVar3 = (this->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
             super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree.m_last;
    ptVar2->parent = ptVar3;
    ptVar3->parent = ptVar2;
  }
  return;
}

Assistant:

void	erase(iterator position)
	{
		this->BSTerase(position);
		--this->m_size;
		if (this->empty()) {
			this->treeInit();
		}
	}